

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError str2tls_max(long *val,char *str)

{
  int iVar1;
  ulong local_28;
  size_t i;
  char *str_local;
  long *val_local;
  
  if (str == (char *)0x0) {
    val_local._4_4_ = PARAM_REQUIRES_PARAMETER;
  }
  else {
    for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
      iVar1 = strcmp(str,str2tls_max::tls_max_array[local_28].tls_max_str);
      if (iVar1 == 0) {
        *val = str2tls_max::tls_max_array[local_28].tls_max;
        return PARAM_OK;
      }
    }
    val_local._4_4_ = PARAM_BAD_USE;
  }
  return val_local._4_4_;
}

Assistant:

ParameterError str2tls_max(long *val, const char *str)
{
   static struct s_tls_max {
    const char *tls_max_str;
    long tls_max;
  } const tls_max_array[] = {
    { "default", CURL_SSLVERSION_MAX_DEFAULT },
    { "1.0",     CURL_SSLVERSION_MAX_TLSv1_0 },
    { "1.1",     CURL_SSLVERSION_MAX_TLSv1_1 },
    { "1.2",     CURL_SSLVERSION_MAX_TLSv1_2 },
    { "1.3",     CURL_SSLVERSION_MAX_TLSv1_3 }
  };
  size_t i = 0;
  if(!str)
    return PARAM_REQUIRES_PARAMETER;
  for(i = 0; i < sizeof(tls_max_array)/sizeof(tls_max_array[0]); i++) {
    if(!strcmp(str, tls_max_array[i].tls_max_str)) {
      *val = tls_max_array[i].tls_max;
      return PARAM_OK;
    }
  }
  return PARAM_BAD_USE;
}